

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

size_t __thiscall CoreML::Specification::ArgMaxLayerParams::ByteSizeLong(ArgMaxLayerParams *this)

{
  long lVar1;
  ulong uVar2;
  size_t sVar3;
  size_t sVar4;
  
  if (this->axis_ == 0) {
    sVar4 = 0;
  }
  else {
    uVar2 = this->axis_ | 1;
    lVar1 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    sVar4 = (ulong)((int)lVar1 * 9 + 0x49U >> 6) + 1;
  }
  sVar3 = sVar4 + 2;
  if (this->removedim_ == false) {
    sVar3 = sVar4;
  }
  this->_cached_size_ = (int)sVar3;
  return sVar3;
}

Assistant:

inline ::google::protobuf::int64 ArgMaxLayerParams::axis() const {
  // @@protoc_insertion_point(field_get:CoreML.Specification.ArgMaxLayerParams.axis)
  return axis_;
}